

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_ObjAlloc(Cba_Ntk_t *p,Cba_ObjType_t Type,int nFins,int nFons)

{
  int Entry;
  int iVar1;
  int local_20;
  int iObj;
  int i;
  int nFons_local;
  int nFins_local;
  Cba_ObjType_t Type_local;
  Cba_Ntk_t *p_local;
  
  Entry = Vec_StrSize(&p->vObjType);
  if (Type == CBA_OBJ_PI) {
    Vec_IntPush(&p->vInputs,Entry);
  }
  else if (Type == CBA_OBJ_PO) {
    Vec_IntPush(&p->vOutputs,Entry);
  }
  Vec_StrPush(&p->vObjType,(char)Type);
  for (local_20 = 0; local_20 < nFins; local_20 = local_20 + 1) {
    Vec_IntPush(&p->vFinFon,0);
  }
  iVar1 = Vec_IntSize(&p->vObjFin0);
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(&p->vFinFon);
    Vec_IntPush(&p->vObjFin0,iVar1);
  }
  for (local_20 = 0; local_20 < nFons; local_20 = local_20 + 1) {
    Vec_IntPush(&p->vFonObj,Entry);
  }
  iVar1 = Vec_IntSize(&p->vObjFon0);
  if (iVar1 != 0) {
    iVar1 = Vec_IntSize(&p->vFonObj);
    Vec_IntPush(&p->vObjFon0,iVar1);
  }
  return Entry;
}

Assistant:

static inline int Cba_ObjAlloc( Cba_Ntk_t * p, Cba_ObjType_t Type, int nFins, int nFons )
{
    int i, iObj = Vec_StrSize(&p->vObjType);
    if ( Type == CBA_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == CBA_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vObjType, (char)Type );
    // add fins
    for ( i = 0; i < nFins; i++ )
        Vec_IntPush( &p->vFinFon, 0 );
    if ( Vec_IntSize(&p->vObjFin0) )
        Vec_IntPush( &p->vObjFin0, Vec_IntSize(&p->vFinFon) );
    // add fons
    for ( i = 0; i < nFons; i++ )
        Vec_IntPush( &p->vFonObj, iObj );
    if ( Vec_IntSize(&p->vObjFon0) )
        Vec_IntPush( &p->vObjFon0, Vec_IntSize(&p->vFonObj) );
    return iObj;
}